

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool __thiscall ON_wString::StartsWithNoCase(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *pwVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ON_Internal_Empty_wString *pOVar6;
  ulong uVar7;
  
  sVar5 = wcslen(wszSub);
  if (sVar5 != 0) {
    pwVar1 = this->m_s;
    pOVar6 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar6 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    if (sVar5 <= (ulong)(long)(pOVar6->header).string_length) {
      iVar3 = tolower(*pwVar1);
      iVar4 = tolower(*wszSub);
      if (iVar3 == iVar4) {
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          if (sVar5 == uVar7) break;
          iVar3 = tolower(pwVar1[uVar7]);
          iVar4 = tolower(wszSub[uVar7]);
          uVar2 = uVar7 + 1;
        } while (iVar3 == iVar4);
        return sVar5 <= uVar7;
      }
    }
  }
  return false;
}

Assistant:

bool ON_wString::StartsWithNoCase(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (tolower(m_s[i]) != tolower(wszSub[i]))
      return false;
  }

  return true;
}